

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void write_features_to_file
               (char *path,_Bool is_test_mode,float *features,int feature_size,int id,
               BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  FILE *__stream;
  ulong uVar1;
  undefined7 in_register_00000031;
  char acStack_138 [264];
  
  if ((int)CONCAT71(in_register_00000031,is_test_mode) != 0) {
    snprintf(acStack_138,0x100,"%s/%s",path,
             get_feature_file_name_feature_file_names_rel +
             *(int *)(get_feature_file_name_feature_file_names_rel + (ulong)(uint)id * 4));
    __stream = fopen64(acStack_138,"a");
    if (__stream != (FILE *)0x0) {
      if (0 < feature_size) {
        uVar1 = 0;
        do {
          fprintf(__stream,"%.6f",(double)features[uVar1]);
          if ((long)uVar1 < (long)(feature_size + -1)) {
            fputc(0x2c,__stream);
          }
          uVar1 = uVar1 + 1;
        } while ((uint)feature_size != uVar1);
      }
      fputc(10,__stream);
      fclose(__stream);
    }
  }
  return;
}

Assistant:

static void write_features_to_file(const char *const path,
                                   const bool is_test_mode,
                                   const float *features,
                                   const int feature_size, const int id,
                                   const BLOCK_SIZE bsize, const int mi_row,
                                   const int mi_col) {
  if (!WRITE_FEATURE_TO_FILE && !is_test_mode) return;

  char filename[256];
  snprintf(filename, sizeof(filename), "%s/%s", path,
           get_feature_file_name(id));
  FILE *pfile = fopen(filename, "a");
  if (pfile == NULL) return;
  if (!is_test_mode) {
    fprintf(pfile, "%d,%d,%d,%d,%d\n", id, (int)bsize, mi_row, mi_col,
            feature_size);
  }
  for (int i = 0; i < feature_size; ++i) {
    fprintf(pfile, "%.6f", features[i]);
    if (i < feature_size - 1) fprintf(pfile, ",");
  }
  fprintf(pfile, "\n");
  fclose(pfile);
}